

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

string * deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::getShaderExtensionDeclaration
                   (string *__return_storage_ptr__,string *extension)

{
  ostream *poVar1;
  ostringstream source;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  if (extension->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,0x98644f);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"#extension ",0xb);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(extension->_M_dataplus)._M_p,
                        extension->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," : enable\n",10);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::ios_base::~ios_base(local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getShaderExtensionDeclaration (std::string extension)
{
	if (extension.empty())
		return std::string("");
	else
	{
		std::ostringstream source;
		source << "#extension " << extension << " : enable\n";
		return source.str();
	}
}